

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall
Privkey_GeneratePubkey_uncompressed_Test::~Privkey_GeneratePubkey_uncompressed_Test
          (Privkey_GeneratePubkey_uncompressed_Test *this)

{
  Privkey_GeneratePubkey_uncompressed_Test *this_local;
  
  ~Privkey_GeneratePubkey_uncompressed_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Privkey, GeneratePubkey_uncompressed) {
  std::string wif = "5JBb5A38fjjeBnngkvRmCsXN6EY4w8jWvckik3hDvYQMcddGY23";
  Privkey privkey = Privkey::FromWif(wif, NetType::kMainnet, false);
  Pubkey pubkey = privkey.GeneratePubkey(false);
  EXPECT_STREQ(
      pubkey.GetHex().c_str(),
      "041777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb78885d348051c6fbd31ac749eb5646481f6d8d9c36f8d157712ca054046a9b8b");
}